

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O1

int lzham::lzham_lib_z_deflateReset(lzham_z_streamp pStream)

{
  bool bVar1;
  int iVar2;
  lzham_compress_state *pState;
  lzham_z_internal_state *plVar3;
  
  iVar2 = -2;
  if ((pStream != (lzham_z_streamp)0x0) &&
     (plVar3 = pStream->state, plVar3 != (lzham_z_internal_state *)0x0)) {
    bVar1 = lzcompressor::reset((lzcompressor *)(plVar3 + 0xa58));
    if (bVar1) {
      *(undefined4 *)(plVar3 + 0xc0f6b8) = 0;
      *(undefined8 *)(plVar3 + 0xc0f650) = 0;
      *(undefined8 *)(plVar3 + 0xc0f658) = 0;
      *(undefined8 *)(plVar3 + 0xc0f660) = 0;
      *(undefined8 *)(plVar3 + 0xc0f668) = 0;
      *(undefined8 *)(plVar3 + 0xc0f669) = 0;
      *(undefined8 *)(plVar3 + 0xc0f671) = 0;
    }
    else {
      plVar3 = (lzham_z_internal_state *)0x0;
    }
    if (plVar3 != (lzham_z_internal_state *)0x0) {
      pStream->state = plVar3;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int lzham_lib_z_deflateReset(lzham_z_streamp pStream)
   {
      if (!pStream)
      {
         LZHAM_LOG_ERROR(6034);
         return LZHAM_Z_STREAM_ERROR;
      }

      lzham_compress_state_ptr pComp = (lzham_compress_state_ptr)pStream->state;
      if (!pComp)
      {
         LZHAM_LOG_ERROR(6035);
         return LZHAM_Z_STREAM_ERROR;
      }

      pComp = lzham_lib_compress_reinit(pComp);
      if (!pComp)
      {
         LZHAM_LOG_ERROR(6036);
         return LZHAM_Z_STREAM_ERROR;
      }

      pStream->state = (struct lzham_z_internal_state *)pComp;

      return LZHAM_Z_OK;
   }